

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

string * __thiscall
duckdb::ART::GenerateConstraintErrorMessage
          (string *__return_storage_ptr__,ART *this,VerifyExistenceType verify_type,string *key_name
          )

{
  int iVar1;
  NotImplementedException *this_00;
  string *psVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_119;
  string type;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38 [32];
  
  iVar1 = (int)CONCAT71(in_register_00000011,verify_type);
  if (iVar1 == 2) {
    psVar2 = key_name;
    ::std::__cxx11::string::string
              ((string *)&local_d8,
               "Violates foreign key constraint because key \"%s\" is still referenced by a foreign key in a different table. If this is an unexpected constraint violation, please refer to our foreign key limitations in the documentation"
               ,(allocator *)&type);
    ::std::__cxx11::string::string((string *)&local_f8,(string *)key_name);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)&local_d8,&local_f8,psVar2);
    ::std::__cxx11::string::~string((string *)&local_f8);
    psVar2 = &local_d8;
  }
  else if (iVar1 == 1) {
    psVar2 = key_name;
    ::std::__cxx11::string::string
              ((string *)&local_98,
               "Violates foreign key constraint because key \"%s\" does not exist in the referenced table"
               ,(allocator *)&type);
    ::std::__cxx11::string::string((string *)&local_b8,(string *)key_name);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)&local_98,&local_b8,psVar2);
    ::std::__cxx11::string::~string((string *)&local_b8);
    psVar2 = &local_98;
  }
  else {
    if (iVar1 != 0) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type,"Type not implemented for VerifyExistenceType",&local_119);
      NotImplementedException::NotImplementedException(this_00,&type);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar1 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
    pcVar3 = "unique";
    if ((char)iVar1 == '\x02') {
      pcVar3 = "primary key";
    }
    ::std::__cxx11::string::string((string *)&type,pcVar3,&local_119);
    ::std::__cxx11::string::string
              (local_38,"Duplicate key \"%s\" violates %s constraint.",&local_119);
    ::std::__cxx11::string::string((string *)&local_58,(string *)key_name);
    ::std::__cxx11::string::string((string *)&local_78,(string *)&type);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_38,&local_58,&local_78,in_R8);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string(local_38);
    psVar2 = &type;
  }
  ::std::__cxx11::string::~string((string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

string ART::GenerateConstraintErrorMessage(VerifyExistenceType verify_type, const string &key_name) {
	switch (verify_type) {
	case VerifyExistenceType::APPEND: {
		// APPEND to PK/UNIQUE table, but node/key already exists in PK/UNIQUE table.
		string type = IsPrimary() ? "primary key" : "unique";
		return StringUtil::Format("Duplicate key \"%s\" violates %s constraint.", key_name, type);
	}
	case VerifyExistenceType::APPEND_FK: {
		// APPEND_FK to FK table, node/key does not exist in PK/UNIQUE table.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" does not exist in the referenced table", key_name);
	}
	case VerifyExistenceType::DELETE_FK: {
		// DELETE_FK that still exists in a FK table, i.e., not a valid delete.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" is still referenced by a foreign "
		    "key in a different table. If this is an unexpected constraint violation, please refer to our "
		    "foreign key limitations in the documentation",
		    key_name);
	}
	default:
		throw NotImplementedException("Type not implemented for VerifyExistenceType");
	}
}